

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_10b450::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite,
               Box2i *dataWindow,Box2i *displayWindow)

{
  bool bVar1;
  int iVar2;
  PixelType PVar3;
  ushort uVar4;
  ushort uVar5;
  char cVar6;
  int *piVar7;
  Array2D<void_*> *pAVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  string *psVar14;
  long lVar15;
  void *pvVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  uint32_t ui;
  int iVar20;
  PixelType PVar21;
  ulong size;
  ulong uVar22;
  ushort uVar23;
  ushort uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  float fVar36;
  ushort local_2f0;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int type;
  undefined4 uStack_284;
  long local_278 [2];
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  Channel local_68 [56];
  ulong uVar28;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)displayWindow,(Box *)dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,
             INCREASING_Y,compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
  poVar13 = (ostream *)std::ostream::operator<<(&std::cout,compression);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  std::ostream::flush();
  iVar2 = (dataWindow->min).y;
  iVar9 = (dataWindow->max).x - (dataWindow->min).x;
  iVar18 = (dataWindow->max).y;
  if (DAT_001ef308._M_current != (anonymous_namespace)::channelTypes) {
    DAT_001ef308._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar20 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,iVar20);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar14 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar14 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar14 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
      }
      if (DAT_001ef308._M_current == DAT_001ef310) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_001ef308,&type);
      }
      else {
        *DAT_001ef308._M_current = type;
        DAT_001ef308._M_current = DAT_001ef308._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      iVar20 = iVar20 + 1;
    } while (channelCount != iVar20);
  }
  iVar18 = iVar18 - iVar2;
  uVar27 = iVar9 + 1;
  uVar28 = (ulong)uVar27;
  uVar32 = (ulong)(iVar18 + 1U);
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  size = (ulong)(uint)channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,size);
  lVar35 = (long)(int)(iVar18 + 1U);
  lVar15 = (long)(int)uVar27;
  if (0 < channelCount) {
    lVar31 = 0;
    do {
      pAVar8 = data._data;
      pvVar16 = operator_new__(-(ulong)((ulong)(lVar35 * lVar15) >> 0x3d != 0) | lVar35 * lVar15 * 8
                              );
      pvVar17 = *(void **)((long)&pAVar8->_data + lVar31);
      if (pvVar17 != (void *)0x0) {
        operator_delete__(pvVar17);
      }
      *(long *)((long)&pAVar8->_sizeX + lVar31) = lVar35;
      *(long *)((long)&pAVar8->_sizeY + lVar31) = lVar15;
      *(void **)((long)&pAVar8->_data + lVar31) = pvVar16;
      lVar31 = lVar31 + 0x18;
    } while (size * 0x18 != lVar31);
  }
  pvVar17 = operator_new__(-(ulong)((ulong)(lVar35 * lVar15) >> 0x3e != 0) | lVar35 * lVar15 * 4);
  if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
    operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
  }
  (anonymous_namespace)::sampleCount._0_8_ = lVar35;
  (anonymous_namespace)::sampleCount._8_8_ = lVar15;
  (anonymous_namespace)::sampleCount._16_8_ = pvVar17;
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCount._16_8_ + (long)(dataWindow->min).x * -4 +
                     (dataWindow->min).y * lVar15 * -4),4,lVar15 * 4,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar35 = 0x10;
    uVar33 = 0;
    do {
      PVar3 = (anonymous_namespace)::channelTypes[uVar33];
      PVar21 = (uint)(PVar3 != UINT) * 3;
      if (PVar3 == HALF) {
        PVar21 = PVar3;
      }
      if (PVar3 == FLOAT) {
        PVar21 = PVar3;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,(int)uVar33);
      std::__cxx11::stringbuf::str();
      iVar2 = (anonymous_namespace)::channelTypes[uVar33];
      uVar25 = (ulong)(iVar2 == 0) << 2;
      if (iVar2 == 1) {
        uVar25 = 2;
      }
      if (iVar2 == 2) {
        uVar25 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_68,PVar21,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar35) +
                          (long)(dataWindow->min).x * -8 + (dataWindow->min).y * lVar15 * -8),8,
                 (long)(int)(uVar27 * 8),uVar25,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((long *)CONCAT44(uStack_284,type) != local_278) {
        operator_delete((long *)CONCAT44(uStack_284,type),local_278[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      uVar33 = uVar33 + 1;
      lVar35 = lVar35 + 0x18;
    } while (size != uVar33);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  bVar1 = 999 < iVar9 || 999 < iVar18;
  if (bulkWrite) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
    std::ostream::flush();
    if (-1 < iVar18) {
      uVar33 = 0;
      do {
        if (-1 < iVar9) {
          iVar30 = (int)uVar33;
          iVar20 = (int)((uVar33 & 0xffffffff) * 0x4104105 >> 0x20);
          iVar2 = iVar30 * uVar27;
          uVar25 = 0;
          do {
            iVar10 = random_int(10);
            iVar19 = (int)uVar25;
            if ((bVar1) &&
               (iVar11 = (int)((uVar25 & 0xffffffff) * 0x4104105 >> 0x20),
               (((uint)(iVar19 - iVar11) >> 1) + iVar11 >> 5) * -0x3f + iVar19 != 0 ||
               (((uint)(iVar30 - iVar20) >> 1) + iVar20 >> 5) * -0x3f + iVar30 != 0)) {
              iVar10 = 0;
            }
            lVar15 = (anonymous_namespace)::sampleCount._8_8_ * uVar33 * 4;
            *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar15 + uVar25 * 4) = iVar10;
            if (0 < channelCount) {
              uVar26 = iVar19 + iVar2;
              fVar36 = (float)((uint)(iVar19 + iVar2) % 0x801);
              uVar12 = (uint)fVar36 & 0x7fffff | 0x800000;
              cVar6 = (char)((uint)fVar36 >> 0x17);
              uVar34 = (uint)fVar36 >> 0xd & 0x3ff;
              local_2f0 = (ushort)(0x80000000 < uVar12 << (cVar6 + 0xa2U & 0x1f)) +
                          (short)(uVar12 >> (0x7eU - cVar6 & 0x1f));
              uVar4 = (ushort)((int)fVar36 + 0x8000fff + (uint)(((uint)fVar36 >> 0xd & 1) != 0) >>
                              0xd);
              if (0x477fefff < (uint)fVar36) {
                uVar4 = 0x7c00;
              }
              uVar5 = (ushort)uVar34 | 0x7c00 | (ushort)(uVar34 == 0);
              if (fVar36 == INFINITY) {
                uVar5 = 0x7c00;
              }
              uVar29 = 0;
              do {
                if (iVar10 < 1) {
                  data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] =
                       (void *)0x0;
                }
                else {
                  if ((anonymous_namespace)::channelTypes[uVar29] == 0) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) << 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  if ((anonymous_namespace)::channelTypes[uVar29] == 1) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) * 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  if ((anonymous_namespace)::channelTypes[uVar29] == 2) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) << 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  piVar7 = (anonymous_namespace)::channelTypes;
                  lVar35 = (anonymous_namespace)::sampleCount._16_8_ + lVar15;
                  if (*(int *)(lVar35 + uVar25 * 4) != 0) {
                    uVar22 = 0;
                    do {
                      if (piVar7[uVar29] == 0) {
                        *(uint *)((long)data._data[uVar29]._data
                                        [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 4)
                             = uVar26 - ((uVar26 / 0x801) * 0x800 + uVar26 / 0x801);
                      }
                      iVar11 = piVar7[uVar29];
                      if (iVar11 == 2) {
                        *(float *)((long)data._data[uVar29]._data
                                         [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 4)
                             = (float)((uint)(iVar19 + iVar2) % 0x801);
                      }
                      else if (iVar11 == 1) {
                        uVar23 = uVar4;
                        if (0x7f7fffff < (uint)fVar36) {
                          uVar23 = uVar5;
                        }
                        uVar24 = local_2f0;
                        if ((uint)fVar36 < 0x33000001) {
                          uVar24 = 0;
                        }
                        if (0x387fffff < (uint)fVar36) {
                          uVar24 = uVar23;
                        }
                        *(ushort *)
                         ((long)data._data[uVar29]._data
                                [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 2) = uVar24
                        ;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar22 < *(uint *)(lVar35 + uVar25 * 4));
                  }
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 != size);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar28);
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar32);
    }
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
    std::ostream::flush();
    if (-1 < iVar18) {
      uVar33 = 0;
      do {
        if (-1 < iVar9) {
          iVar30 = (int)uVar33;
          iVar20 = (int)((uVar33 & 0xffffffff) * 0x4104105 >> 0x20);
          iVar2 = iVar30 * uVar27;
          uVar25 = 0;
          do {
            iVar10 = random_int(10);
            iVar19 = (int)uVar25;
            if ((bVar1) &&
               (iVar11 = (int)((uVar25 & 0xffffffff) * 0x4104105 >> 0x20),
               (((uint)(iVar19 - iVar11) >> 1) + iVar11 >> 5) * -0x3f + iVar19 != 0 ||
               (((uint)(iVar30 - iVar20) >> 1) + iVar20 >> 5) * -0x3f + iVar30 != 0)) {
              iVar10 = 0;
            }
            lVar15 = (anonymous_namespace)::sampleCount._8_8_ * uVar33 * 4;
            *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar15 + uVar25 * 4) = iVar10;
            if (0 < channelCount) {
              uVar26 = iVar19 + iVar2;
              fVar36 = (float)((uint)(iVar19 + iVar2) % 0x801);
              uVar12 = (uint)fVar36 & 0x7fffff | 0x800000;
              cVar6 = (char)((uint)fVar36 >> 0x17);
              uVar34 = (uint)fVar36 >> 0xd & 0x3ff;
              local_2f0 = (ushort)(0x80000000 < uVar12 << (cVar6 + 0xa2U & 0x1f)) +
                          (short)(uVar12 >> (0x7eU - cVar6 & 0x1f));
              uVar4 = (ushort)((int)fVar36 + 0x8000fff + (uint)(((uint)fVar36 >> 0xd & 1) != 0) >>
                              0xd);
              if (0x477fefff < (uint)fVar36) {
                uVar4 = 0x7c00;
              }
              uVar5 = (ushort)uVar34 | 0x7c00 | (ushort)(uVar34 == 0);
              if (fVar36 == INFINITY) {
                uVar5 = 0x7c00;
              }
              uVar29 = 0;
              do {
                if (iVar10 < 1) {
                  data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] =
                       (void *)0x0;
                }
                else {
                  if ((anonymous_namespace)::channelTypes[uVar29] == 0) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) << 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  if ((anonymous_namespace)::channelTypes[uVar29] == 1) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) * 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  if ((anonymous_namespace)::channelTypes[uVar29] == 2) {
                    pvVar17 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar15 + uVar25 * 4) << 2);
                    data._data[uVar29]._data[data._data[uVar29]._sizeY * uVar33 + uVar25] = pvVar17;
                  }
                  piVar7 = (anonymous_namespace)::channelTypes;
                  lVar35 = (anonymous_namespace)::sampleCount._16_8_ + lVar15;
                  if (*(int *)(lVar35 + uVar25 * 4) != 0) {
                    uVar22 = 0;
                    do {
                      if (piVar7[uVar29] == 0) {
                        *(uint *)((long)data._data[uVar29]._data
                                        [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 4)
                             = uVar26 - ((uVar26 / 0x801) * 0x800 + uVar26 / 0x801);
                      }
                      iVar11 = piVar7[uVar29];
                      if (iVar11 == 2) {
                        *(float *)((long)data._data[uVar29]._data
                                         [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 4)
                             = (float)((uint)(iVar19 + iVar2) % 0x801);
                      }
                      else if (iVar11 == 1) {
                        uVar23 = uVar4;
                        if (0x7f7fffff < (uint)fVar36) {
                          uVar23 = uVar5;
                        }
                        uVar24 = local_2f0;
                        if ((uint)fVar36 < 0x33000001) {
                          uVar24 = 0;
                        }
                        if (0x387fffff < (uint)fVar36) {
                          uVar24 = uVar23;
                        }
                        *(ushort *)
                         ((long)data._data[uVar29]._data
                                [data._data[uVar29]._sizeY * uVar33 + uVar25] + uVar22 * 2) = uVar24
                        ;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar22 < *(uint *)(lVar35 + uVar25 * 4));
                  }
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 != size);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar28);
        }
        Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar32);
    }
  }
  if (-1 < iVar18) {
    uVar33 = 0;
    do {
      if (-1 < iVar9) {
        uVar25 = 0;
        do {
          if (0 < channelCount) {
            lVar15 = 4;
            uVar29 = 0;
            do {
              if (((anonymous_namespace)::channelTypes[uVar29] == 0) &&
                 (pvVar17 = *(void **)(*(long *)((long)data._data + lVar15 * 4 + -8) * uVar33 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar15 * 4) +
                                      uVar25 * 8), pvVar17 != (void *)0x0)) {
                operator_delete__(pvVar17);
              }
              if (((anonymous_namespace)::channelTypes[uVar29] == 1) &&
                 (pvVar17 = *(void **)(*(long *)((long)data._data + lVar15 * 4 + -8) * uVar33 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar15 * 4) +
                                      uVar25 * 8), pvVar17 != (void *)0x0)) {
                operator_delete__(pvVar17);
              }
              if (((anonymous_namespace)::channelTypes[uVar29] == 2) &&
                 (pvVar17 = *(void **)(*(long *)((long)data._data + lVar15 * 4 + -8) * uVar33 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar15 * 4) +
                                      uVar25 * 8), pvVar17 != (void *)0x0)) {
                operator_delete__(pvVar17);
              }
              uVar29 = uVar29 + 1;
              lVar15 = lVar15 + 6;
            } while (size != uVar29);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar28);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar32);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  return;
}

Assistant:

void
generateRandomFile (
    const std::string filename,
    int               channelCount,
    Compression       compression,
    bool              bulkWrite,
    const Box2i&      dataWindow,
    const Box2i&      displayWindow)
{
    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    cout << "compression " << compression << " " << flush;

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCount.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    int maxSamples = 10;

    bool bigFile = width > 1000 || height > 1000;

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples

                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {
                    if (samples > 0)
                    {

                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
        }

        file.writePixels (height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples
                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {

                    if (samples > 0)
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
            file.writePixels (1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }
}